

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDir::setSorting(QDir *this,SortFlags sort)

{
  QDirPrivate *this_00;
  
  this_00 = QSharedDataPointer<QDirPrivate>::data(&this->d_ptr);
  QDirPrivate::clearCache(this_00,KeepMetaData);
  (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
       = (Int)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.
              i;
  return;
}

Assistant:

void QDir::setSorting(SortFlags sort)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->sort = sort;
}